

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Polygons *polys)

{
  vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *this_00;
  iterator __position;
  long lVar1;
  long64 lVar2;
  pointer ppOVar3;
  OutPt *pOVar4;
  ulong uVar5;
  ulong __new_size;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(polys,(long)(this->m_PolyOuts).
                       super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_PolyOuts).
                       super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppOVar3 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __new_size = 0;
  if ((this->m_PolyOuts).
      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar3) {
    uVar5 = 0;
    do {
      if (ppOVar3[uVar5]->pts != (OutPt *)0x0) {
        this_00 = (vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                  ((polys->
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (int)__new_size);
        if (*(long *)(this_00 + 8) != *(long *)this_00) {
          *(long *)(this_00 + 8) = *(long *)this_00;
        }
        pOVar4 = (this->m_PolyOuts).
                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5]->pts;
        do {
          __position._M_current = *(IntPoint **)(this_00 + 8);
          if (__position._M_current == *(IntPoint **)(this_00 + 0x10)) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>(this_00,__position,&pOVar4->pt);
          }
          else {
            lVar2 = (pOVar4->pt).Y;
            (__position._M_current)->X = (pOVar4->pt).X;
            (__position._M_current)->Y = lVar2;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
          }
          pOVar4 = pOVar4->next;
        } while (pOVar4 != (this->m_PolyOuts).
                           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5]->pts);
        lVar1 = *(long *)this_00;
        if ((ulong)(*(long *)(this_00 + 8) - lVar1) < 0x21) {
          if (*(long *)(this_00 + 8) != lVar1) {
            *(long *)(this_00 + 8) = lVar1;
          }
        }
        else {
          __new_size = (ulong)((int)__new_size + 1);
        }
      }
      uVar5 = uVar5 + 1;
      ppOVar3 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m_PolyOuts).
                                   super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >> 3))
    ;
    __new_size = (ulong)(int)__new_size;
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(polys,__new_size);
  return;
}

Assistant:

void Clipper::BuildResult(Polygons &polys)
{
  int k = 0;
  polys.resize(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (m_PolyOuts[i]->pts)
    {
      Polygon* pg = &polys[k];
      pg->clear();
      OutPt* p = m_PolyOuts[i]->pts;
      do
      {
        pg->push_back(p->pt);
        p = p->next;
      } while (p != m_PolyOuts[i]->pts);
      //make sure each polygon has at least 3 vertices ...
      if (pg->size() < 3) pg->clear(); else k++;
    }
  }
  polys.resize(k);
}